

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateSuccessCode
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *code)

{
  undefined8 value;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string tag;
  string *code_local;
  VulkanHppGenerator *this_local;
  
  tag.field_2._8_8_ = code;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  findTag((string *)local_40,this,code,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  value = tag.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"VK_",&local_119);
  stripPrefix(&local_f8,(string *)value,&local_118);
  stripPostfix(&local_d8,&local_f8,(string *)local_40);
  toCamelCase(&local_b8,&local_d8,false);
  std::operator+(&local_98,"VULKAN_HPP_NAMESPACE::Result::e",&local_b8);
  std::operator+(__return_storage_ptr__,&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateSuccessCode( std::string const & code ) const
{
  std::string tag = findTag( code );
  // on each success code: prepend 'VULKAN_HPP_NAMESPACE::Result::e', strip "VK_" and a tag, convert it to camel
  // case, and add the tag again
  return "VULKAN_HPP_NAMESPACE::Result::e" + toCamelCase( stripPostfix( stripPrefix( code, "VK_" ), tag ) ) + tag;
}